

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void detectAndDisplay(Mat *frame)

{
  undefined8 *puVar1;
  long lVar2;
  int i;
  ulong uVar3;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  undefined4 local_178 [2];
  undefined1 *local_170;
  undefined8 local_168;
  vector<cv::Mat,_std::allocator<cv::Mat>_> rgbChannels;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 local_130;
  Scalar_<double> local_128;
  Rect local_108;
  Mat frame_gray;
  Mat local_90 [96];
  
  faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            (&rgbChannels,3,(allocator_type *)&frame_gray);
  local_128.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  _frame_gray = 0x1010000;
  local_128.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x2050000;
  local_128.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&rgbChannels;
  cv::split((_InputArray *)&frame_gray,(_OutputArray *)&local_128);
  cv::Mat::Mat(&frame_gray,
               rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc0);
  local_128.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_128.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
  local_130 = 0x9600000096;
  local_138 = 0;
  local_128.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&frame_gray;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,face_cascade,&local_128,&faces,2,6,&local_130,&local_138);
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar3) break;
    local_168 = 0;
    local_178[0] = 0x3010000;
    local_170 = debugImage;
    puVar1 = (undefined8 *)
             ((long)&(faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->x + lVar2);
    local_148 = *puVar1;
    uStack_140 = puVar1[1];
    cv::Scalar_<double>::Scalar_(&local_128,1234.0);
    cv::rectangle(local_178,&local_148,&local_128,1,8,0);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x10;
  }
  if (faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    cv::Mat::Mat(local_90,&frame_gray);
    local_108.x = (faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->x;
    local_108.y = (faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->y;
    local_108.width =
         (faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start)->width;
    local_108.height =
         (faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start)->height;
    findEyes(local_90,&local_108);
    cv::Mat::~Mat(local_90);
  }
  cv::Mat::~Mat(&frame_gray);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&rgbChannels);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  return;
}

Assistant:

void detectAndDisplay( cv::Mat frame ) {
  std::vector<cv::Rect> faces;
  //cv::Mat frame_gray;

  std::vector<cv::Mat> rgbChannels(3);
  cv::split(frame, rgbChannels);
  cv::Mat frame_gray = rgbChannels[2];

  //cvtColor( frame, frame_gray, CV_BGR2GRAY );
  //equalizeHist( frame_gray, frame_gray );
  //cv::pow(frame_gray, CV_64F, frame_gray);
  //-- Detect faces
  face_cascade.detectMultiScale( frame_gray, faces, 1.1, 2, 0|cv::CASCADE_SCALE_IMAGE|cv::CASCADE_FIND_BIGGEST_OBJECT, cv::Size(150, 150) );
//  findSkin(debugImage);



  for( int i = 0; i < faces.size(); i++ )
  {
    rectangle(debugImage, faces[i], 1234);
  }
  //-- Show what you got

  if (faces.size() > 0) {
    auto max = faces[0].width;
    int pos = 0;
    for(int i = 1; i < faces.size(); i++){
      if(faces[i].width > max){
        max = faces[i].width;
        pos = i;
      }
    }
    findEyes(frame_gray, faces[0]);
  }
}